

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmx-impl.inc.c
# Opt level: O2

void gen_vmrglw(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o;
  TCGv_ptr pTVar1;
  TCGv_ptr pTVar2;
  TCGv_ptr pTVar3;
  uintptr_t o_1;
  uintptr_t o_2;
  TCGTemp *local_38;
  TCGTemp *local_30;
  TCGTemp *local_28;
  
  if (ctx->altivec_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    pTVar1 = gen_avr_ptr(tcg_ctx,*(ushort *)((long)&ctx->opcode + 2) & 0x1f);
    pTVar2 = gen_avr_ptr(tcg_ctx,ctx->opcode >> 0xb & 0x1f);
    pTVar3 = gen_avr_ptr(tcg_ctx,ctx->opcode >> 0x15 & 0x1f);
    local_38 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    local_30 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
    local_28 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    tcg_gen_callN_ppc64(tcg_ctx,helper_vmrglw_ppc64,(TCGTemp *)0x0,3,&local_38);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    return;
  }
  gen_exception(ctx,0x49);
  return;
}

Assistant:

static void trans_vmrgew(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int VT = rD(ctx->opcode);
    int VA = rA(ctx->opcode);
    int VB = rB(ctx->opcode);
    TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 avr = tcg_temp_new_i64(tcg_ctx);

    get_avr64(tcg_ctx, avr, VB, true);
    tcg_gen_shri_i64(tcg_ctx, tmp, avr, 32);
    get_avr64(tcg_ctx, avr, VA, true);
    tcg_gen_deposit_i64(tcg_ctx, avr, avr, tmp, 0, 32);
    set_avr64(tcg_ctx, VT, avr, true);

    get_avr64(tcg_ctx, avr, VB, false);
    tcg_gen_shri_i64(tcg_ctx, tmp, avr, 32);
    get_avr64(tcg_ctx, avr, VA, false);
    tcg_gen_deposit_i64(tcg_ctx, avr, avr, tmp, 0, 32);
    set_avr64(tcg_ctx, VT, avr, false);

    tcg_temp_free_i64(tcg_ctx, tmp);
    tcg_temp_free_i64(tcg_ctx, avr);
}